

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O0

yyjson_mut_val *
duckdb_yyjson::yyjson_merge_patch(yyjson_mut_doc *doc,yyjson_val *orig,yyjson_val *patch)

{
  _func_void_void_ptr_void_ptr *__s2;
  _func_void_ptr_void_ptr_void_ptr_size_t_size_t *p_Var1;
  long lVar2;
  yyjson_mut_val *pyVar3;
  void *__s2_00;
  int iVar4;
  long *plVar5;
  yyjson_mut_val *pyVar6;
  yyjson_mut_val *pyVar7;
  ulong uVar8;
  yyjson_val *in_RDX;
  yyjson_mut_doc *in_RSI;
  long in_RDI;
  bool bVar9;
  bool bVar10;
  yyjson_mut_val *merged_val;
  yyjson_mut_val *mut_val;
  yyjson_mut_val *mut_key;
  yyjson_mut_val *builder;
  yyjson_val local_orig;
  yyjson_val *patch_val;
  yyjson_val *orig_val;
  yyjson_val *key;
  usize max;
  usize idx;
  size_t ofs_3;
  size_t ctn_ofs_3;
  bool is_ctn_3;
  size_t ofs_1;
  size_t ctn_ofs_1;
  bool is_ctn_1;
  yyjson_mut_val *val;
  yyjson_val_pool *pool;
  yyjson_alc *alc;
  yyjson_mut_val *val_1;
  yyjson_mut_val *next_key;
  yyjson_mut_val *prev_val;
  yyjson_mut_val *next_key_1;
  yyjson_mut_val *prev_val_1;
  uint64_t tag_15;
  uint64_t tag_7;
  uint8_t tag_13;
  uint8_t tag_5;
  uint8_t tag_1;
  uint8_t tag;
  uint8_t tag_9;
  uint8_t tag_2;
  yyjson_val *key_2;
  size_t len_1;
  size_t ofs_2;
  size_t ctn_ofs_2;
  bool is_ctn_2;
  uint8_t tag_11;
  yyjson_val *key_1;
  size_t len;
  size_t ofs;
  size_t ctn_ofs;
  bool is_ctn;
  uint8_t tag_3;
  uint8_t tag_10;
  uint8_t mask;
  uint8_t mask_2;
  uint8_t mask_1;
  uint8_t mask_3;
  uint8_t tag_14;
  uint8_t tag_6;
  uint8_t tag_16;
  uint8_t tag_8;
  uint8_t tag_12;
  uint8_t tag_4;
  char *local_578;
  ulong local_568;
  bool local_55a;
  usize in_stack_fffffffffffffaa8;
  yyjson_alc *in_stack_fffffffffffffab0;
  yyjson_mut_doc *i_vals;
  undefined7 in_stack_fffffffffffffab8;
  undefined1 in_stack_fffffffffffffabf;
  ulong local_540;
  char *local_530;
  bool local_522;
  _func_void_ptr_void_ptr_void_ptr_size_t_size_t **local_520;
  yyjson_mut_doc *local_518;
  yyjson_mut_val *local_4e8;
  yyjson_val_uni local_4e0;
  yyjson_val *local_4d8;
  void **local_4d0;
  yyjson_val *local_4c8;
  yyjson_val *in_stack_fffffffffffffb40;
  yyjson_mut_doc *in_stack_fffffffffffffb48;
  yyjson_mut_doc *pyVar11;
  yyjson_mut_val *local_498;
  yyjson_mut_val *local_420;
  yyjson_mut_val *local_3f0;
  _func_void_ptr_void_ptr_void_ptr_size_t_size_t **local_218;
  ulong local_210;
  void **local_1f0;
  yyjson_val *local_198;
  ulong local_190;
  yyjson_val *local_170;
  
  if (in_RDX == (yyjson_val *)0x0) {
    bVar9 = false;
  }
  else {
    bVar9 = ((byte)in_RDX->tag & 7) == 7;
  }
  if (!bVar9) {
    pyVar6 = yyjson_val_mut_copy(in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
    return pyVar6;
  }
  if (in_RDI != 0) {
    plVar5 = (long *)(in_RDI + 0x50);
    if (((*(long *)(in_RDI + 0x58) - *plVar5) / 0x18 == 0) &&
       (bVar9 = unsafe_yyjson_val_pool_grow
                          ((yyjson_val_pool *)
                           CONCAT17(in_stack_fffffffffffffabf,in_stack_fffffffffffffab8),
                           in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8),
       ((bVar9 ^ 0xffU) & 1) != 0)) {
      local_3f0 = (yyjson_mut_val *)0x0;
    }
    else {
      local_3f0 = (yyjson_mut_val *)*plVar5;
      *plVar5 = *plVar5 + 0x18;
    }
    if (local_3f0 != (yyjson_mut_val *)0x0) {
      local_3f0->tag = 7;
      local_420 = local_3f0;
      goto LAB_027563f1;
    }
  }
  local_420 = (yyjson_mut_val *)0x0;
LAB_027563f1:
  if (local_420 == (yyjson_mut_val *)0x0) {
    local_498 = (yyjson_mut_val *)0x0;
  }
  else {
    memset(&local_4e8,0,0x10);
    if (in_RSI == (yyjson_mut_doc *)0x0) {
      bVar9 = false;
    }
    else {
      bVar9 = ((byte)in_RSI->root & 7) == 7;
    }
    if (!bVar9) {
      in_RSI = (yyjson_mut_doc *)&local_4e8;
      local_4e8 = (yyjson_mut_val *)local_420->tag;
      local_4e0 = local_420->uni;
    }
    if (in_RSI != (yyjson_mut_doc *)&local_4e8) {
      pyVar11 = (yyjson_mut_doc *)0x0;
      if (in_RSI == (yyjson_mut_doc *)0x0) {
        bVar9 = false;
      }
      else {
        bVar9 = ((byte)in_RSI->root & 7) == 7;
      }
      if (bVar9) {
        local_518 = (yyjson_mut_doc *)((ulong)in_RSI->root >> 8);
      }
      else {
        local_518 = (yyjson_mut_doc *)0x0;
      }
      if (in_RSI == (yyjson_mut_doc *)0x0) {
        local_520 = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t **)0x0;
      }
      else {
        local_520 = &(in_RSI->alc).realloc;
      }
      local_4c8 = (yyjson_val *)local_520;
      while (local_4d0 = (void **)((long)local_4c8 + 0x10), pyVar11 < local_518) {
        __s2 = *(_func_void_void_ptr_void_ptr **)((long)local_4c8 + 8);
        p_Var1 = *(_func_void_ptr_void_ptr_void_ptr_size_t_size_t **)local_4c8;
        if (in_RDX == (yyjson_val *)0x0) {
          local_522 = false;
        }
        else {
          local_522 = ((byte)in_RDX->tag & 7) == 7;
        }
        local_522 = local_522 && __s2 != (_func_void_void_ptr_void_ptr *)0x0;
        if (local_522) {
          local_198 = in_RDX + 1;
          local_190 = in_RDX->tag >> 8;
          while (local_190 != 0) {
            bVar9 = false;
            if (local_198->tag >> 8 == (ulong)p_Var1 >> 8) {
              iVar4 = memcmp((local_198->uni).ptr,__s2,(ulong)p_Var1 >> 8);
              bVar9 = iVar4 == 0;
            }
            if (bVar9) {
              local_170 = local_198 + 1;
              goto LAB_02756948;
            }
            local_530 = local_198[1].uni.str;
            if (((byte)local_198[1].tag & 6) != 6) {
              local_530 = (char *)0x10;
            }
            local_198 = (yyjson_val *)(local_530 + (long)&local_198[1].tag);
            local_190 = local_190 - 1;
          }
        }
        local_170 = (yyjson_val *)0x0;
LAB_02756948:
        local_4d8 = local_170;
        if (local_170 == (yyjson_val *)0x0) {
          pyVar6 = yyjson_val_mut_copy(pyVar11,(yyjson_val *)local_518);
          pyVar7 = yyjson_val_mut_copy(pyVar11,(yyjson_val *)local_518);
          if (local_420 == (yyjson_mut_val *)0x0) {
            bVar9 = false;
          }
          else {
            bVar9 = ((byte)local_420->tag & 7) == 7;
          }
          bVar10 = false;
          if (bVar9) {
            if (pyVar6 == (yyjson_mut_val *)0x0) {
              bVar9 = false;
            }
            else {
              bVar9 = ((byte)pyVar6->tag & 7) == 5;
            }
            bVar10 = false;
            if (bVar9) {
              bVar10 = pyVar7 != (yyjson_mut_val *)0x0;
            }
          }
          if (bVar10) {
            uVar8 = local_420->tag >> 8;
            if (uVar8 == 0) {
              pyVar7->next = pyVar6;
            }
            else {
              lVar2 = *(long *)((local_420->uni).u64 + 0x10);
              pyVar3 = *(yyjson_mut_val **)(lVar2 + 0x10);
              *(yyjson_mut_val **)(lVar2 + 0x10) = pyVar6;
              pyVar7->next = pyVar3;
            }
            pyVar6->next = pyVar7;
            (local_420->uni).str = (char *)pyVar6;
            local_420->tag = (uVar8 + 1) * 0x100 | local_420->tag & 0xff;
            bVar9 = true;
          }
          else {
            bVar9 = false;
          }
          if (!bVar9) {
            return (yyjson_mut_val *)0x0;
          }
        }
        pyVar11 = (yyjson_mut_doc *)((long)&pyVar11->root + 1);
        local_540 = (ulong)local_4d0[1];
        if (((byte)*local_4d0 & 6) != 6) {
          local_540 = 0x10;
        }
        local_4c8 = (yyjson_val *)((long)local_4d0 + local_540);
      }
    }
    pyVar11 = (yyjson_mut_doc *)0x0;
    if (in_RDX == (yyjson_val *)0x0) {
      bVar9 = false;
    }
    else {
      bVar9 = ((byte)in_RDX->tag & 7) == 7;
    }
    if (bVar9) {
      i_vals = (yyjson_mut_doc *)(in_RDX->tag >> 8);
    }
    else {
      i_vals = (yyjson_mut_doc *)0x0;
    }
    if (in_RDX == (yyjson_val *)0x0) {
      local_4c8 = (yyjson_val *)0x0;
    }
    else {
      local_4c8 = in_RDX + 1;
    }
    while (local_4d8 = local_4c8 + 1, pyVar11 < i_vals) {
      if (((byte)local_4d8->tag & 7) != 2) {
        pyVar6 = yyjson_val_mut_copy(pyVar11,(yyjson_val *)i_vals);
        __s2_00 = (local_4c8->uni).ptr;
        uVar8 = local_4c8->tag >> 8;
        if (in_RSI == (yyjson_mut_doc *)0x0) {
          local_55a = false;
        }
        else {
          local_55a = ((byte)in_RSI->root & 7) == 7;
        }
        local_55a = local_55a && __s2_00 != (void *)0x0;
        if (local_55a) {
          local_218 = &(in_RSI->alc).realloc;
          local_210 = (ulong)in_RSI->root >> 8;
          while (local_210 != 0) {
            bVar9 = false;
            if ((ulong)*local_218 >> 8 == uVar8) {
              iVar4 = memcmp(local_218[1],__s2_00,uVar8);
              bVar9 = iVar4 == 0;
            }
            if (bVar9) {
              local_1f0 = local_218 + 2;
              goto LAB_02757230;
            }
            local_568 = (ulong)local_218[3];
            if (((byte)local_218[2] & 6) != 6) {
              local_568 = 0x10;
            }
            local_218 = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t **)
                        ((long)(local_218 + 2) + local_568);
            local_210 = local_210 - 1;
          }
        }
        local_1f0 = (void **)0x0;
LAB_02757230:
        local_4d0 = local_1f0;
        pyVar7 = yyjson_merge_patch(in_RSI,in_RDX,(yyjson_val *)pyVar11);
        if (local_420 == (yyjson_mut_val *)0x0) {
          bVar9 = false;
        }
        else {
          bVar9 = ((byte)local_420->tag & 7) == 7;
        }
        bVar10 = false;
        if (bVar9) {
          if (pyVar6 == (yyjson_mut_val *)0x0) {
            bVar9 = false;
          }
          else {
            bVar9 = ((byte)pyVar6->tag & 7) == 5;
          }
          bVar10 = false;
          if (bVar9) {
            bVar10 = pyVar7 != (yyjson_mut_val *)0x0;
          }
        }
        if (bVar10) {
          uVar8 = local_420->tag >> 8;
          if (uVar8 == 0) {
            pyVar7->next = pyVar6;
          }
          else {
            lVar2 = *(long *)((local_420->uni).u64 + 0x10);
            pyVar3 = *(yyjson_mut_val **)(lVar2 + 0x10);
            *(yyjson_mut_val **)(lVar2 + 0x10) = pyVar6;
            pyVar7->next = pyVar3;
          }
          pyVar6->next = pyVar7;
          (local_420->uni).str = (char *)pyVar6;
          local_420->tag = (uVar8 + 1) * 0x100 | local_420->tag & 0xff;
          bVar9 = true;
        }
        else {
          bVar9 = false;
        }
        if (!bVar9) {
          return (yyjson_mut_val *)0x0;
        }
      }
      pyVar11 = (yyjson_mut_doc *)((long)&pyVar11->root + 1);
      local_578 = (local_4d8->uni).str;
      if (((byte)local_4d8->tag & 6) != 6) {
        local_578 = (char *)0x10;
      }
      local_4c8 = (yyjson_val *)(local_578 + (long)&local_4d8->tag);
    }
    local_498 = local_420;
  }
  return local_498;
}

Assistant:

yyjson_mut_val *yyjson_merge_patch(yyjson_mut_doc *doc,
                                   yyjson_val *orig,
                                   yyjson_val *patch) {
    usize idx, max;
    yyjson_val *key, *orig_val, *patch_val, local_orig;
    yyjson_mut_val *builder, *mut_key, *mut_val, *merged_val;

    if (unlikely(!yyjson_is_obj(patch))) {
        return yyjson_val_mut_copy(doc, patch);
    }

    builder = yyjson_mut_obj(doc);
    if (unlikely(!builder)) return NULL;

    memset(&local_orig, 0, sizeof(local_orig));
    if (!yyjson_is_obj(orig)) {
        orig = &local_orig;
        orig->tag = builder->tag;
        orig->uni = builder->uni;
    }

    /* If orig is contributing, copy any items not modified by the patch */
    if (orig != &local_orig) {
        yyjson_obj_foreach(orig, idx, max, key, orig_val) {
            patch_val = yyjson_obj_getn(patch,
                                        unsafe_yyjson_get_str(key),
                                        unsafe_yyjson_get_len(key));
            if (!patch_val) {
                mut_key = yyjson_val_mut_copy(doc, key);
                mut_val = yyjson_val_mut_copy(doc, orig_val);
                if (!yyjson_mut_obj_add(builder, mut_key, mut_val)) return NULL;
            }
        }
    }

    /* Merge items modified by the patch. */
    yyjson_obj_foreach(patch, idx, max, key, patch_val) {
        /* null indicates the field is removed. */
        if (unsafe_yyjson_is_null(patch_val)) {
            continue;
        }
        mut_key = yyjson_val_mut_copy(doc, key);
        orig_val = yyjson_obj_getn(orig,
                                   unsafe_yyjson_get_str(key),
                                   unsafe_yyjson_get_len(key));
        merged_val = yyjson_merge_patch(doc, orig_val, patch_val);
        if (!yyjson_mut_obj_add(builder, mut_key, merged_val)) return NULL;
    }

    return builder;
}